

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHash.h
# Opt level: O2

ValueType * __thiscall
HighsHashTable<MatrixColumn,_int>::operator[](HighsHashTable<MatrixColumn,_int> *this,KeyType *key)

{
  byte bVar1;
  uchar uVar2;
  _Head_base<0UL,_HighsHashTableEntry<MatrixColumn,_int>_*,_false> _Var3;
  uchar *puVar4;
  ulong uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  bool bVar9;
  ValueType *pVVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  u8 meta;
  u64 pos;
  Entry entry;
  u64 maxPos;
  u64 startPos;
  uchar local_71;
  ulong local_70;
  HighsHashTableEntry<MatrixColumn,_int> local_68;
  ulong local_48;
  ulong local_40;
  undefined1 local_38 [32];
  
  _Var3._M_head_impl =
       (this->entries)._M_t.
       super___uniq_ptr_impl<HighsHashTableEntry<MatrixColumn,_int>,_HighsHashTable<MatrixColumn,_int>::OpNewDeleter>
       ._M_t.
       super__Tuple_impl<0UL,_HighsHashTableEntry<MatrixColumn,_int>_*,_HighsHashTable<MatrixColumn,_int>::OpNewDeleter>
       .super__Head_base<0UL,_HighsHashTableEntry<MatrixColumn,_int>_*,_false>._M_head_impl;
  bVar9 = findPosition(this,key,&local_71,&local_40,&local_48,&local_70);
  if (bVar9) {
    return (int *)((long)(_Var3._M_head_impl + local_70) + 0x14);
  }
  uVar11 = this->tableSizeMask;
  if ((this->numElements == uVar11 * 7 + 7 >> 3) || (local_70 == local_48)) {
    growTable(this);
  }
  else {
    local_68.key_.cost = key->cost;
    local_68.key_.lb = key->lb;
    local_68.key_.ub = key->ub;
    local_68.key_.integral = key->integral;
    local_68.value_ = 0;
    local_68.key_.len = key->len;
    uVar8 = _Var3._M_head_impl + local_70;
    this->numElements = this->numElements + 1;
    uVar12 = local_48;
    do {
      puVar4 = (this->metadata)._M_t.
               super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
               super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
      bVar1 = puVar4[local_70];
      if (-1 < (char)bVar1) {
        puVar4[local_70] = local_71;
        *(undefined8 *)((long)(_Var3._M_head_impl + local_70) + 0x10) = local_68._16_8_;
        *(undefined8 *)&_Var3._M_head_impl[local_70].key_ = local_68.key_._0_8_;
        *(undefined8 *)((long)&_Var3._M_head_impl[local_70].key_ + 8) = local_68.key_._8_8_;
        return (int *)(uVar8 + 0x14);
      }
      uVar13 = (ulong)((int)local_70 - (uint)bVar1 & 0x7f);
      if (uVar13 < (local_70 - local_40 & uVar11)) {
        local_38._16_4_ = local_68.key_.len;
        local_38._20_4_ = local_68.value_;
        local_38._0_4_ = local_68.key_.cost;
        local_38._4_4_ = local_68.key_.lb;
        local_38._8_4_ = local_68.key_.ub;
        local_38._12_4_ = local_68.key_.integral;
        uVar5 = *(ulong *)((long)(_Var3._M_head_impl + local_70) + 0x10);
        uVar6 = *(undefined8 *)&_Var3._M_head_impl[local_70].key_;
        uVar7 = *(undefined8 *)((long)&_Var3._M_head_impl[local_70].key_ + 8);
        *(undefined8 *)&_Var3._M_head_impl[local_70].key_ = local_68.key_._0_8_;
        *(undefined8 *)((long)&_Var3._M_head_impl[local_70].key_ + 8) = local_68.key_._8_8_;
        *(undefined8 *)((long)(_Var3._M_head_impl + local_70) + 0x10) = local_68._16_8_;
        puVar4 = (this->metadata)._M_t.
                 super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
                 super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
        uVar2 = puVar4[local_70];
        puVar4[local_70] = local_71;
        uVar11 = this->tableSizeMask;
        local_40 = local_70 - uVar13 & uVar11;
        uVar12 = local_40 + 0x7f & uVar11;
        local_71 = uVar2;
        local_68.key_._0_8_ = uVar6;
        local_68.key_._8_8_ = uVar7;
        local_68._16_8_ = uVar5;
        local_48 = uVar12;
      }
      local_70 = local_70 + 1 & uVar11;
    } while (local_70 != uVar12);
    growTable(this);
    HighsHashTable<MatrixColumn,int>::insert<HighsHashTableEntry<MatrixColumn,int>>
              ((HighsHashTable<MatrixColumn,int> *)this,&local_68);
  }
  pVVar10 = operator[](this,key);
  return pVVar10;
}

Assistant:

ValueType& operator[](const KeyType& key) {
    Entry* entryArray = entries.get();
    u64 pos, startPos, maxPos;
    u8 meta;
    if (findPosition(key, meta, startPos, maxPos, pos))
      return entryArray[pos].value();

    if (numElements == ((tableSizeMask + 1) * 7) / 8 || pos == maxPos) {
      growTable();
      return (*this)[key];
    }

    using std::swap;
    ValueType& insertLocation = entryArray[pos].value();
    Entry entry(key);
    ++numElements;

    do {
      if (!occupied(metadata[pos])) {
        metadata[pos] = meta;
        new (&entryArray[pos]) Entry{std::move(entry)};
        return insertLocation;
      }

      u64 currentDistance = (pos - startPos) & tableSizeMask;
      u64 distanceOfCurrentOccupant = distanceFromIdealSlot(pos);
      if (currentDistance > distanceOfCurrentOccupant) {
        // steal the position
        swap(entry, entryArray[pos]);
        swap(meta, metadata[pos]);

        startPos = (pos - distanceOfCurrentOccupant) & tableSizeMask;
        maxPos = (startPos + maxDistance()) & tableSizeMask;
      }
      pos = (pos + 1) & tableSizeMask;
    } while (pos != maxPos);

    growTable();
    insert(std::move(entry));
    return (*this)[key];
  }